

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_active_later_nolock_(event *ev,int res)

{
  event_base *base_00;
  int iVar1;
  event_callback *evcb;
  event_base *base;
  int res_local;
  event *ev_local;
  
  base_00 = ev->ev_base;
  if (((base_00->th_base_lock != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
     (iVar1 = evthread_is_debug_lock_held_(base_00->th_base_lock), iVar1 == 0)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/event.c"
               ,0xba8,"evthread_is_debug_lock_held_((base)->th_base_lock)",
               "event_active_later_nolock_");
  }
  if (((ev->ev_evcallback).evcb_flags & 0x28U) == 0) {
    ev->ev_res = (ushort)res;
    evcb = event_to_event_callback(ev);
    event_callback_activate_later_nolock_(base_00,evcb);
  }
  else {
    ev->ev_res = ev->ev_res | (ushort)res;
  }
  return;
}

Assistant:

void
event_active_later_nolock_(struct event *ev, int res)
{
	struct event_base *base = ev->ev_base;
	EVENT_BASE_ASSERT_LOCKED(base);

	if (ev->ev_flags & (EVLIST_ACTIVE|EVLIST_ACTIVE_LATER)) {
		/* We get different kinds of events, add them together */
		ev->ev_res |= res;
		return;
	}

	ev->ev_res = res;

	event_callback_activate_later_nolock_(base, event_to_event_callback(ev));
}